

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void GetBestGreenRedToBlue
               (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
               VP8LMultipliers prev_y,int quality,uint32_t *accumulated_blue_histo,
               VP8LMultipliers *best_tx)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int64_t iVar4;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  long in_stack_00000018;
  int64_t cur_diff;
  int red_to_blue_cur;
  int green_to_blue_cur;
  int axis;
  int delta;
  int64_t best_diff;
  int iter;
  int red_to_blue_best;
  int green_to_blue_best;
  int iters;
  int8_t delta_lut [7];
  int8_t offset [8] [2];
  int in_stack_0000036c;
  int in_stack_00000370;
  int in_stack_00000374;
  uint32_t *in_stack_00000378;
  VP8LMultipliers in_stack_00000382;
  VP8LMultipliers in_stack_00000385;
  int in_stack_00000390;
  int in_stack_00000398;
  uint32_t *in_stack_000003a0;
  int local_84;
  int local_68;
  int64_t local_58;
  int local_50;
  int local_4c;
  int local_48;
  char local_3f [49];
  undefined2 local_e;
  undefined1 local_c;
  undefined2 local_b;
  undefined1 local_9;
  
  local_b = (undefined2)in_R8D;
  local_9 = (undefined1)((uint)in_R8D >> 0x10);
  local_c = (undefined1)((uint)in_R9D >> 0x10);
  local_e = (undefined2)in_R9D;
  builtin_strncpy(local_3f,"\x10\x10\b\x04\x02\x02\x02",8);
  local_3f[8] = -1;
  local_3f[9] = '\0';
  local_3f[10] = '\x01';
  local_3f[0xb] = -1;
  local_3f[0xc] = '\0';
  local_3f[0xd] = '\x01';
  local_3f[0xe] = '\0';
  local_3f[0xf] = -1;
  local_3f[0x10] = -1;
  local_3f[0x11] = -1;
  local_3f[0x12] = '\x01';
  local_3f[0x13] = '\x01';
  local_3f[0x14] = -1;
  local_3f[0x15] = '\x01';
  local_3f[0x16] = '\x01';
  if (in_stack_00000008 < 0x19) {
    local_84 = 1;
  }
  else {
    local_84 = 4;
    if (0x32 < in_stack_00000008) {
      local_84 = 7;
    }
  }
  local_48 = 0;
  local_4c = 0;
  local_58 = GetPredictionCostCrossColorBlue
                       (in_stack_00000378,in_stack_00000374,in_stack_00000370,in_stack_0000036c,
                        in_stack_00000385,in_stack_00000382,in_stack_00000390,in_stack_00000398,
                        in_stack_000003a0);
  for (local_50 = 0; local_50 < local_84; local_50 = local_50 + 1) {
    iVar3 = (int)local_3f[local_50];
    for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
      cVar1 = local_3f[(long)local_68 * 2 + 7];
      cVar2 = local_3f[(long)local_68 * 2 + 8];
      iVar4 = GetPredictionCostCrossColorBlue
                        (in_stack_00000378,in_stack_00000374,in_stack_00000370,in_stack_0000036c,
                         in_stack_00000385,in_stack_00000382,in_stack_00000390,in_stack_00000398,
                         in_stack_000003a0);
      if (iVar4 < local_58) {
        local_58 = iVar4;
        local_4c = cVar2 * iVar3 + local_4c;
        local_48 = cVar1 * iVar3 + local_48;
      }
      if ((in_stack_00000008 < 0x19) && (local_50 == 4)) break;
    }
    if (((iVar3 == 2) && (local_48 == 0)) && (local_4c == 0)) break;
  }
  *(char *)(in_stack_00000018 + 1) = (char)local_48;
  *(char *)(in_stack_00000018 + 2) = (char)local_4c;
  return;
}

Assistant:

static void GetBestGreenRedToBlue(const uint32_t* argb, int stride,
                                  int tile_width, int tile_height,
                                  VP8LMultipliers prev_x,
                                  VP8LMultipliers prev_y, int quality,
                                  const uint32_t accumulated_blue_histo[256],
                                  VP8LMultipliers* const best_tx) {
  const int8_t offset[kGreenRedToBlueNumAxis][2] =
      {{0, -1}, {0, 1}, {-1, 0}, {1, 0}, {-1, -1}, {-1, 1}, {1, -1}, {1, 1}};
  const int8_t delta_lut[kGreenRedToBlueMaxIters] = { 16, 16, 8, 4, 2, 2, 2 };
  const int iters =
      (quality < 25) ? 1 : (quality > 50) ? kGreenRedToBlueMaxIters : 4;
  int green_to_blue_best = 0;
  int red_to_blue_best = 0;
  int iter;
  // Initial value at origin:
  int64_t best_diff = GetPredictionCostCrossColorBlue(
      argb, stride, tile_width, tile_height, prev_x, prev_y, green_to_blue_best,
      red_to_blue_best, accumulated_blue_histo);
  for (iter = 0; iter < iters; ++iter) {
    const int delta = delta_lut[iter];
    int axis;
    for (axis = 0; axis < kGreenRedToBlueNumAxis; ++axis) {
      const int green_to_blue_cur =
          offset[axis][0] * delta + green_to_blue_best;
      const int red_to_blue_cur = offset[axis][1] * delta + red_to_blue_best;
      const int64_t cur_diff = GetPredictionCostCrossColorBlue(
          argb, stride, tile_width, tile_height, prev_x, prev_y,
          green_to_blue_cur, red_to_blue_cur, accumulated_blue_histo);
      if (cur_diff < best_diff) {
        best_diff = cur_diff;
        green_to_blue_best = green_to_blue_cur;
        red_to_blue_best = red_to_blue_cur;
      }
      if (quality < 25 && iter == 4) {
        // Only axis aligned diffs for lower quality.
        break;  // next iter.
      }
    }
    if (delta == 2 && green_to_blue_best == 0 && red_to_blue_best == 0) {
      // Further iterations would not help.
      break;  // out of iter-loop.
    }
  }
  best_tx->green_to_blue = green_to_blue_best & 0xff;
  best_tx->red_to_blue = red_to_blue_best & 0xff;
}